

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::UCharsTrieElement::setTo
          (UCharsTrieElement *this,UnicodeString *s,int32_t val,UnicodeString *strings,
          UErrorCode *errorCode)

{
  short sVar1;
  int iVar2;
  int32_t srcLength;
  UChar local_22;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (s->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  if (iVar2 < 0x10000) {
    sVar1 = (strings->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar2 = (strings->fUnion).fFields.fLength;
    }
    else {
      iVar2 = (int)sVar1 >> 5;
    }
    this->stringOffset = iVar2;
    UnicodeString::doAppend(strings,&local_22,0,1);
    this->value = val;
    sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      srcLength = (s->fUnion).fFields.fLength;
    }
    else {
      srcLength = (int)sVar1 >> 5;
    }
    UnicodeString::doAppend(strings,s,0,srcLength);
  }
  else {
    *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }